

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usecase_test.cc
# Opt level: O3

void __thiscall
SnapHandlePool::SnapHandlePool
          (SnapHandlePool *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenames,int count)

{
  value_type local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_38,filenames);
  FileHandlePool::FileHandlePool(&this->super_FileHandlePool,&local_38,count);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  (this->super_FileHandlePool)._vptr_FileHandlePool = (_func_int **)&PTR__SnapHandlePool_00157d10;
  (this->snap_pool_vector).super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->snap_pool_vector).super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->snap_pool_vector).super__Vector_base<PoolEntry_*,_std::allocator<PoolEntry_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = (value_type)0x0;
  std::vector<PoolEntry_*,_std::allocator<PoolEntry_*>_>::resize
            (&this->snap_pool_vector,(long)count,&local_40);
  pthread_mutex_init((pthread_mutex_t *)&this->snaplock,(pthread_mutexattr_t *)0x0);
  FileHandlePool::addStatToAgg(&this->super_FileHandlePool,4,"clone snapshot");
  FileHandlePool::addStatToAgg(&this->super_FileHandlePool,6,"iterator-seek");
  return;
}

Assistant:

SnapHandlePool(std::vector<std::string> filenames, int count)
        : FileHandlePool(filenames, count) {
        snap_pool_vector.resize(count, nullptr);
        mutex_init(&snaplock);

        addStatToAgg(CLONE_SNAP, "clone snapshot");
        addStatToAgg(ITR_SEEK, "iterator-seek");
    }